

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O3

void __thiscall SGParser::Generator::NFA::TraverseGraph(NFA *this,NFANode *seed,NodeSet *visited)

{
  _Rb_tree_header *p_Var1;
  pointer ppNVar2;
  NFANode *seed_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pointer ppNVar5;
  NFANode *local_38;
  NFANode *seed_local;
  
  local_38 = seed;
  std::
  _Rb_tree<SGParser::Generator::NFANode*,SGParser::Generator::NFANode*,std::_Identity<SGParser::Generator::NFANode*>,std::less<SGParser::Generator::NFANode*>,std::allocator<SGParser::Generator::NFANode*>>
  ::_M_insert_unique<SGParser::Generator::NFANode*const&>
            ((_Rb_tree<SGParser::Generator::NFANode*,SGParser::Generator::NFANode*,std::_Identity<SGParser::Generator::NFANode*>,std::less<SGParser::Generator::NFANode*>,std::allocator<SGParser::Generator::NFANode*>>
              *)visited,&local_38);
  ppNVar5 = (local_38->LinkPtr).
            super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppNVar2 = (local_38->LinkPtr).
            super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar5 != ppNVar2) {
    p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
    do {
      seed_00 = *ppNVar5;
      p_Var3 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      if (p_Var3 == (_Base_ptr)0x0) {
LAB_0012b61d:
        TraverseGraph(this,seed_00,visited);
      }
      else {
        do {
          if (*(NFANode **)(p_Var3 + 1) >= seed_00) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[*(NFANode **)(p_Var3 + 1) < seed_00];
        } while (p_Var3 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var4 == p_Var1) ||
           (seed_00 < (NFANode *)((_Rb_tree_header *)p_Var4)->_M_node_count)) goto LAB_0012b61d;
      }
      ppNVar5 = ppNVar5 + 1;
    } while (ppNVar5 != ppNVar2);
  }
  return;
}

Assistant:

void NFA::TraverseGraph(NFANode* seed, NodeSet& visited) const {
    // Insert node if it's not already there
    visited.insert(seed);

    for (const auto node : seed->LinkPtr) {
        // If the node is not already inserted
        if (visited.find(node) == visited.end()) {
            // Traverse the rest of the graph (traversing will also insert the node)
            TraverseGraph(node, visited);
        }
    }
}